

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> * __thiscall
math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
operator/=(uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this,
          uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *other)

{
  size_type sVar1;
  uint uVar2;
  pointer pvVar3;
  bool bVar4;
  long lVar5;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> dStack_28;
  
  if (this == other) {
    pvVar3 = (this->values).
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elems;
    *pvVar3 = 1;
    uVar2 = (this->values).
            super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
            elem_count;
    for (lVar5 = 4; (ulong)uVar2 << 2 != lVar5; lVar5 = lVar5 + 4) {
      *(undefined4 *)((long)pvVar3 + lVar5) = 0;
    }
  }
  else {
    bVar4 = is_zero(other);
    if (bVar4) {
      limits_helper_max<false>();
      sVar1 = (this->values).
              super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
              elem_count;
      (this->values).
      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elem_count
           = dStack_28.elem_count;
      pvVar3 = (this->values).
               super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
               elems;
      (this->values).
      super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.elems =
           dStack_28.elems;
      dStack_28.elem_count = sVar1;
      dStack_28.elems = pvVar3;
      util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
      ~dynamic_array(&dStack_28);
    }
    else {
      eval_divide_knuth(this,other,
                        (uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)0x0
                       );
    }
  }
  return this;
}

Assistant:

constexpr auto operator/=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        values.front() = static_cast<limb_type>(UINT8_C(1));

        detail::fill_unsafe(detail::advance_and_point(values.begin(), 1U), values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
      }
      else if(other.is_zero())
      {
        static_cast<void>(operator=(limits_helper_max<IsSigned>()));
      }
      else
      {
        // Unary division function.

        const auto numer_was_neg = is_neg(*this);
        const auto denom_was_neg = is_neg(other);

        if(numer_was_neg || denom_was_neg)
        {
          using local_unsigned_wide_type = uintwide_t<Width2, limb_type, AllocatorType, false>;

          local_unsigned_wide_type a(*this);
          local_unsigned_wide_type b(other);

          if(numer_was_neg) { a.negate(); }
          if(denom_was_neg) { b.negate(); }

          a.eval_divide_knuth(b);

          if(numer_was_neg != denom_was_neg) { a.negate(); }

          values = a.values;
        }
        else
        {
          eval_divide_knuth(other);
        }
      }

      return *this;
    }